

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.c
# Opt level: O2

void plygo(runcxdef *run,voccxdef *voc,tiocxdef *tio,objnum preinit,char *restore_fname)

{
  char *__src;
  char cVar1;
  errcxdef *ctx;
  bool bVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  long lVar7;
  char *scrnam;
  bool bVar8;
  int inited;
  char buf_1 [128];
  char fname [256];
  char filbuf [128];
  errdef fr_;
  
  ctx = run->runcxerr;
  outformat("\\H+<?T2>\\H-");
  __src = voc->voccxredobuf;
  bVar2 = true;
  do {
    while (tiosetactor(voc->voccxtio,voc->voccxme), bVar2) {
      voc->voccxpreinit = preinit;
      fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      if (fr_.errcode == 0) {
        fr_.errprv = ctx->errcxptr;
        ctx->errcxptr = &fr_;
        run->runcxsp = run->runcxstk;
        run->runcxhp = run->runcxheap;
        run->runcxdbg->dbgcxdep = 0;
        run->runcxdbg->dbgcxfcn = 0;
        voc_stk_ini(voc,0x1f400);
        if (preinit != 0xffff) {
          runfn(run,preinit,0);
        }
        ctx->errcxptr = fr_.errprv;
        break;
      }
LAB_001fe2ab:
      ctx->errcxptr = fr_.errprv;
      if (fr_.errcode != 0x3fa) {
LAB_001fe78f:
        errrse1(ctx,&fr_);
      }
      bVar2 = false;
      fr_.errcode = 0x3fa;
    }
    if ((restore_fname == (char *)0x0) || (voc->voccxinitrestore == 0xffff)) {
      fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      if (fr_.errcode != 0) goto LAB_001fe2ab;
      fr_.errprv = ctx->errcxptr;
      ctx->errcxptr = &fr_;
      run->runcxsp = run->runcxstk;
      run->runcxhp = run->runcxheap;
      run->runcxdbg->dbgcxdep = 0;
      run->runcxdbg->dbgcxfcn = 0;
      voc_stk_ini(voc,0x1f400);
      runfn(run,voc->voccxini,0);
      ctx->errcxptr = fr_.errprv;
    }
    bVar2 = false;
    iVar3 = os_paramfile(filbuf);
    if (iVar3 != 0) {
      restore_fname = filbuf;
    }
    if (restore_fname != (char *)0x0) {
      if (voc->voccxinitrestore == 0xffff) {
        os_printz("\n\n[Restoring saved game]\n\n");
        iVar3 = fiorso(voc,restore_fname);
        if (iVar3 != 0) {
          sprintf((char *)&fr_,"\n\nError: unable to restore file \"%s\"\n\n",restore_fname);
          os_printz((char *)&fr_);
        }
      }
      else {
        lVar7 = 0;
        while ((cVar1 = *restore_fname, cVar1 != '\0' && (lVar7 < 0x1ffe))) {
          if (cVar1 == '\\') {
            lVar6 = lVar7 + 2;
            fr_.errfac[lVar7 + -0xb] = '\\';
          }
          else {
            lVar6 = lVar7 + 1;
          }
          fr_.errfac[lVar7 + -0xc] = cVar1;
          restore_fname = restore_fname + 1;
          lVar7 = lVar6;
        }
        run->runcxsp = run->runcxstk;
        run->runcxhp = run->runcxheap;
        run->runcxdbg->dbgcxdep = 0;
        run->runcxdbg->dbgcxfcn = 0;
        voc_stk_ini(voc,0x1f400);
        runpstr(run,(char *)&fr_,(int)lVar7,0);
        runfn(run,voc->voccxinitrestore,1);
      }
    }
    *__src = '\0';
    do {
      iVar3 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      fr_.errcode = iVar3;
      if (iVar3 == 0) {
        fr_.errprv = ctx->errcxptr;
        ctx->errcxptr = &fr_;
        if (voc->voccxredo == 0) {
          outshow();
          outflush();
          run->runcxsp = run->runcxstk;
          run->runcxhp = run->runcxheap;
          run->runcxdbg->dbgcxdep = 0;
          run->runcxdbg->dbgcxfcn = 0;
          vocread(voc,0xffff,0xffff,buf_1,0x80,0);
          if (buf_1[0] != '@') {
            if (voc->voccxredo != 0) goto LAB_001fe53e;
            goto LAB_001fe55d;
          }
          if (buf_1[1] == '!') {
            iVar3 = 1;
LAB_001fe67a:
            scrnam = buf_1 + 2;
          }
          else {
            iVar3 = 0;
            scrnam = buf_1 + 1;
            if (buf_1[1] == '@') {
              iVar3 = 0;
              setmore(0);
              os_nonstop_mode(1);
              goto LAB_001fe67a;
            }
          }
          while( true ) {
            cVar1 = *scrnam;
            if ((long)cVar1 < 1) break;
            ppuVar5 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) goto LAB_001fe6a5;
            scrnam = scrnam + 1;
          }
          if (cVar1 == '\0') {
            iVar4 = tio_askfile("Read script file:",fname,0x100,1,5);
            if (iVar4 == 0) {
              qasopn(fname,iVar3);
            }
          }
          else {
LAB_001fe6a5:
            qasopn(scrnam,iVar3);
          }
        }
        else {
LAB_001fe53e:
          if (*__src != '\0') {
            strcpy(buf_1,__src);
            *__src = '\0';
          }
LAB_001fe55d:
          voc->voccxredo = 0;
          os_break();
          voccmd(voc,buf_1,0x80);
        }
        ctx->errcxptr = fr_.errprv;
LAB_001fe585:
        bVar8 = false;
      }
      else {
        ctx->errcxptr = fr_.errprv;
        if (iVar3 - 0x3fbU < 0xfffffffe) {
          if ((iVar3 == 0x3f6) && (voc->voccxredo != 0)) goto LAB_001fe585;
          (*ctx->errcxlog)(ctx->errcxlgc,fr_.errfac,iVar3,fr_.erraac,fr_.erraav);
          bVar8 = false;
          if ((iVar3 == 0x3de) && (voc->voccxundo != (objucxdef *)0x0)) {
            fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
            bVar8 = false;
            if (fr_.errcode == 0) {
              fr_.errprv = ctx->errcxptr;
              ctx->errcxptr = &fr_;
              objundo(voc->voccxmem,voc->voccxundo);
              ctx->errcxptr = fr_.errprv;
            }
            else {
              ctx->errcxptr = fr_.errprv;
              if (fr_.errcode - 0xcbU < 0xfffffffe) goto LAB_001fe78f;
            }
          }
        }
        else {
          bVar8 = iVar3 == 0x3fa;
          if (iVar3 == 0x3f9) {
            fr_.errcode = _setjmp((__jmp_buf_tag *)fr_.errbuf);
            if (fr_.errcode == 0) {
              fr_.errprv = ctx->errcxptr;
              ctx->errcxptr = &fr_;
              run->runcxdbg->dbgcxfcn = 0;
              run->runcxdbg->dbgcxdep = 0;
              dbguquitting(run->runcxdbg);
              ctx->errcxptr = fr_.errprv;
            }
            else {
              ctx->errcxptr = fr_.errprv;
              if (fr_.errcode == 0x3fa) break;
              if (fr_.errcode != 0x3f9) goto LAB_001fe78f;
            }
            return;
          }
        }
      }
    } while (!bVar8);
    restore_fname = (char *)0x0;
  } while( true );
}

Assistant:

void plygo(runcxdef *run, voccxdef *voc, tiocxdef *tio, objnum preinit,
           char *restore_fname)
{
    int       err;
    errcxdef *ec = run->runcxerr;
    char      filbuf[128];
    int       first_time;
    int noreg inited = FALSE;

    NOREG((&inited));

    first_time = TRUE;

    /* 
     *   Write out the special <?T2> HTML sequence, in case we're on an HTML
     *   system.  This tells the HTML parser to use the parsing rules for
     *   TADS 2 callers. 
     */
    outformat("\\H+<?T2>\\H-");
    
startover:
    if (!inited)
    {
        /* use Me as the format-string actor for preinit and init */
        tiosetactor(voc->voccxtio, voc->voccxme);

        /*
         *   Run preinit, if it hasn't been run yet.  Note that we only
         *   do this the first time through.  If we come back here via the
         *   restart function, preinit will already have been run in the
         *   restart function itself, so we don't need to run it again.
         */
        if (first_time)
        {
            /* make a note that we've been through here once already */
            first_time = FALSE;

            /* remember the preinit function for later use in restarting */
            voc->voccxpreinit = preinit;

            /* run the preinit() function */
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run preinit */
                if (preinit != MCMONINV)
                    runfn(run, preinit, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;

                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
        
        /* 
         *   Run the "init" function.  Do NOT run init if we're restoring
         *   a game directly from the command line AND there's an
         *   initRestore function defined. 
         */
        if (restore_fname == 0 || voc->voccxinitrestore == MCMONINV)
        {
            ERRBEGIN(ec)
            {
                /* reset the interpreter */
                runrst(run);

                /* reset the parser */
                voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

                /* run init */
                runfn(run, (objnum)voc->voccxini, 0);
            }
            ERRCATCH(ec, err)
            {
                /* if they restarted, go back and start over */
                if (err == ERR_RUNRESTART)
                    goto startover;
                
                /* resignal the error */
                errrse(ec);
            }
            ERREND(ec);
        }
    }
    
    /* next time through, we'll need to run init again */
    inited = FALSE;

    /* 
     *   check for startup parameter file to restore - if there's a
     *   system-specific parameter file specified, pretend that it was
     *   specified as the restore file 
     */
    if (os_paramfile(filbuf))
        restore_fname = filbuf;

    /* check for a file to restore */
    if (restore_fname != 0)
    {
        /*
         *   Check to see if the game file supports the initRestore
         *   function.  If so, call it to restore the game.  If not,
         *   restore the game directly. 
         */
        if (voc->voccxinitrestore != MCMONINV)
        {
            char restore_buf[OSFNMAX*2];
            char *src;
            char *dst;
            
            /* convert any backslashes to double backslashes */
            for (src = restore_fname, dst = restore_buf ;
                 *src != '\0' && dst + 2 < restore_buf + sizeof(restore_buf) ;
                 ++src)
            {
                switch(*src)
                {
                case '\\':
                    /* it's a backslash - double it */
                    *dst++ = '\\';
                    *dst++ = '\\';
                    break;

                default:
                    /* copy the character as-is */
                    *dst++ = *src;
                }
            }
            
            /* 
             *   all the game's initRestore function with the name of
             *   saved game file to restore as the argument 
             */

            /* reset the interpreter */
            runrst(run);

            /* reset the parser */
            voc_stk_ini(voc, (uint)VOC_STACK_SIZE);

            /* push the game file name and run initRestore */
            runpstr(run, restore_buf, dst - restore_buf, 0);
            runfn(run, (objnum)voc->voccxinitrestore, 1);
        }
        else
        {
            /* restore the game */
            os_printz("\n\n[Restoring saved game]\n\n");
            err = fiorso(voc, restore_fname);
            if (err)
            {
                char buf[60 + OSFNMAX];

                sprintf(buf, "\n\nError: unable to restore file \"%s\"\n\n",
                        restore_fname);
                os_printz(buf);
            }
        }

        /* forget the saved game name, in case we restore */
        restore_fname = 0;
    }

    /* clear out the redo command buffer */
    voc->voccxredobuf[0] = '\0';
    
    /* read and execute commands */
    for (;;)
    {
        char buf[128];
        
        err = 0;
        ERRBEGIN(ec)
            
        /* read a new command if there's nothing to redo */
        if (!voc->voccxredo)
        {
            /* reset hidden output so we're showing output */
            tioshow(tio);
            tioflush(tio);

            /* clear the interpreter stack */
            runrst(run);

            /* read a command */
            vocread(voc, MCMONINV, MCMONINV, buf, (int)sizeof(buf), 0);

            /* special qa checking */
            if (buf[0] == '@')
            {
                int   quiet = FALSE;
                char *p;
                
                p = buf + 1;
                if (*p == '@')
                {
                    /* turn off MORE mode */
                    setmore(0);

                    /* set NONSTOP mode in the OS layer */
                    os_nonstop_mode(TRUE);

                    /* skip the extra '@' */
                    ++p;
                }
                else if (*p == '!')
                {
                    quiet = TRUE;
                    ++p;
                }
                while (*p != '\0' && t_isspace(*p)) ++p;
                if (*p != '\0')
                {
                    /* open the named file */
                    qasopn(p, quiet);
                }
                else
                {
                    char fname[256];

                    /* no file was named - ask the user to select a file */
                    if (tio_askfile("Read script file:", fname, sizeof(fname),
                                    OS_AFP_OPEN, OSFTCMD) == 0)
                        qasopn(fname, quiet);
                }
                goto end_loop;
            }
        }

        /* 
         *   If there's redo in the redo buffer, use it now.  If the
         *   buffer is empty and the redo flag is set, we'll just
         *   re-execute whatever's in our internal buffer.
         */
        if (voc->voccxredo && voc->voccxredobuf[0] != '\0')
        {
            /* copy the redo buffer into our internal buffer */
            strcpy(buf, voc->voccxredobuf);

            /* we've consumed it now, so clear it out */
            voc->voccxredobuf[0] = '\0';
        }

        /* we've now consumed the redo */
        voc->voccxredo = FALSE;

        /* clear any pending break that's queued up */
        (void)os_break();

        /* execute the command */
        (void)voccmd(voc, buf, (uint)sizeof(buf));
        
    end_loop:
        ERRCATCH(ec, err)
        {
            if (err != ERR_RUNQUIT
                && err != ERR_RUNRESTART
                && !(err == ERR_RUNABRT && voc->voccxredo))
                errclog(ec);
        }
        ERREND(ec);

        /* on interrupt, undo last command (which was partially executed) */
        if (err == ERR_USRINT && voc->voccxundo)
        {
            ERRBEGIN(ec)
                objundo(voc->voccxmem, voc->voccxundo);
            ERRCATCH(ec, err)
                if (err != ERR_NOUNDO && err != ERR_ICUNDO)
                    errrse(ec);
            ERREND(ec)
        }
            
        /* if they want to quit, we're done */
        if (err == ERR_RUNQUIT)
            break;
        else if (err == ERR_RUNRESTART)
            goto startover;
    }

    /*
     *   If we're quitting, give the debugger one last chance at taking
     *   control.  If it just returns, we can go ahead and terminate, but
     *   if it wants it can restart the game by calling bifrst() as
     *   normal.  
     */
    ERRBEGIN(ec)
    {
        /* clear anything in the debugger stack trace */
        run->runcxdbg->dbgcxfcn = 0;
        run->runcxdbg->dbgcxdep = 0;

        /* tell the debugger the game has exited */
        dbguquitting(run->runcxdbg);
    }
    ERRCATCH(ec, err)
    {
        switch(err)
        {
        case ERR_RUNRESTART:
            /* they restarted the game - re-enter the play loop */
            goto startover;

        case ERR_RUNQUIT:
            /* quitting - proceed to return as normal */
            break;

        default:
            /* resignal any other error */
            errrse(ec);
        }
    }
    ERREND(ec);
}